

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer-shared.cpp
# Opt level: O0

Ref makeSigning(Ref node,JsSign sign)

{
  size_t sVar1;
  Ref RVar2;
  Ref RVar3;
  Ref in_R8;
  IString op;
  undefined8 *local_50;
  JsSign sign_local;
  Ref node_local;
  
  if (sign != JS_SIGNED && sign != JS_UNSIGNED) {
    __assert_fail("sign == JS_SIGNED || sign == JS_UNSIGNED",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/optimizer-shared.cpp"
                  ,0x88,"Ref makeSigning(Ref, JsSign)");
  }
  if (sign == JS_SIGNED) {
    local_50 = &cashew::OR;
  }
  else {
    local_50 = &cashew::TRSHIFT;
  }
  RVar3.inst = (Value *)*local_50;
  sVar1 = local_50[1];
  RVar2 = cashew::ValueBuilder::makeNum(0.0);
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = sVar1;
  RVar3 = cashew::ValueBuilder::makeBinary(node.inst,RVar3,op,in_R8);
  return (Ref)RVar3.inst;
}

Assistant:

Ref makeSigning(Ref node, JsSign sign) {
  assert(sign == JS_SIGNED || sign == JS_UNSIGNED);
  return ValueBuilder::makeBinary(
    node, sign == JS_SIGNED ? OR : TRSHIFT, ValueBuilder::makeNum(0));
}